

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_IHDR(ucvector *out,uint w,uint h,LodePNGColorType colortype,uint bitdepth,
                  uint interlace_method)

{
  uint uVar1;
  undefined4 in_ECX;
  undefined4 in_R8D;
  undefined4 in_R9D;
  ucvector header;
  uint error;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  ucvector *in_stack_ffffffffffffffd0;
  uchar *in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  
  uVar2 = 0;
  ucvector_init((ucvector *)&stack0xffffffffffffffc8);
  lodepng_add32bitInt(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  lodepng_add32bitInt(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  ucvector_push_back((ucvector *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),'\0')
  ;
  ucvector_push_back((ucvector *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),'\0')
  ;
  ucvector_push_back((ucvector *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),'\0')
  ;
  ucvector_push_back((ucvector *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),'\0')
  ;
  ucvector_push_back((ucvector *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),'\0')
  ;
  uVar1 = addChunk((ucvector *)CONCAT44(in_ECX,in_R8D),(char *)CONCAT44(in_R9D,uVar2),
                   in_stack_ffffffffffffffd8,(size_t)in_stack_ffffffffffffffd0);
  ucvector_cleanup((void *)0x29627e);
  return uVar1;
}

Assistant:

static unsigned addChunk_IHDR(ucvector* out, unsigned w, unsigned h,
                              LodePNGColorType colortype, unsigned bitdepth, unsigned interlace_method)
{
  unsigned error = 0;
  ucvector header;
  ucvector_init(&header);

  lodepng_add32bitInt(&header, w); /*width*/
  lodepng_add32bitInt(&header, h); /*height*/
  ucvector_push_back(&header, (unsigned char)bitdepth); /*bit depth*/
  ucvector_push_back(&header, (unsigned char)colortype); /*color type*/
  ucvector_push_back(&header, 0); /*compression method*/
  ucvector_push_back(&header, 0); /*filter method*/
  ucvector_push_back(&header, interlace_method); /*interlace method*/

  error = addChunk(out, "IHDR", header.data, header.size);
  ucvector_cleanup(&header);

  return error;
}